

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PZMatrixMarket.cpp
# Opt level: O0

void TPZMatrixMarket::Read<long_double>(string *filename,TPZSBMatrix<long_double> *fmat)

{
  void *pvVar1;
  long *in_RSI;
  string *in_RDI;
  longdouble val_1;
  int64_t col_1;
  int64_t row_1;
  int64_t el_1;
  string buf_1;
  ifstream input_1;
  longdouble val;
  int64_t col;
  int64_t row;
  int64_t el;
  string buf;
  ifstream input;
  int64_t band;
  int64_t nlower;
  int64_t nsup;
  int64_t nonzero;
  int64_t ncol;
  int64_t nrow;
  int64_t in_stack_fffffffffffffab0;
  TPZSBMatrix<long_double> *in_stack_fffffffffffffab8;
  longdouble local_4f8;
  long local_4e8;
  long local_4e0;
  long local_4d8;
  string local_4d0 [32];
  istream local_4b0 [520];
  longdouble local_2a8;
  long local_290;
  long local_288;
  long local_280;
  string local_268 [32];
  istream local_248 [520];
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long *local_10;
  
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  local_10 = in_RSI;
  std::ifstream::ifstream(local_248,in_RDI,_S_in);
  std::__cxx11::string::string(local_268);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_248,local_268);
  pvVar1 = (void *)std::istream::operator>>(local_248,&local_18);
  pvVar1 = (void *)std::istream::operator>>(pvVar1,&local_20);
  std::istream::operator>>(pvVar1,&local_28);
  for (local_280 = 0; local_280 < local_28; local_280 = local_280 + 1) {
    pvVar1 = (void *)std::istream::operator>>(local_248,&local_288);
    pvVar1 = (void *)std::istream::operator>>(pvVar1,&local_290);
    std::istream::operator>>(pvVar1,&local_2a8);
    if (local_40 < local_288 - local_290) {
      local_40 = local_288 - local_290;
    }
    if (local_40 < local_290 - local_288) {
      local_40 = local_290 - local_288;
    }
    local_288 = local_288 + -1;
    local_290 = local_290 + -1;
    if (local_290 < local_288) {
      local_38 = local_38 + 1;
    }
    if (local_288 < local_290) {
      local_30 = local_30 + 1;
    }
  }
  std::__cxx11::string::~string(local_268);
  std::ifstream::~ifstream(local_248);
  (**(code **)(*local_10 + 0x70))(local_10,local_18,local_20);
  TPZSBMatrix<long_double>::SetBand(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::ifstream::ifstream(local_4b0,in_RDI,_S_in);
  std::__cxx11::string::string(local_4d0);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_4b0,local_4d0);
  pvVar1 = (void *)std::istream::operator>>(local_4b0,&local_18);
  pvVar1 = (void *)std::istream::operator>>(pvVar1,&local_20);
  std::istream::operator>>(pvVar1,&local_28);
  for (local_4d8 = 0; local_4d8 < local_28; local_4d8 = local_4d8 + 1) {
    pvVar1 = (void *)std::istream::operator>>(local_4b0,&local_4e0);
    pvVar1 = (void *)std::istream::operator>>(pvVar1,&local_4e8);
    std::istream::operator>>(pvVar1,&local_4f8);
    local_4e0 = local_4e0 + -1;
    local_4e8 = local_4e8 + -1;
    (**(code **)(*local_10 + 0x118))(local_10,local_4e0,local_4e8,&local_4f8);
  }
  std::__cxx11::string::~string(local_4d0);
  std::ifstream::~ifstream(local_4b0);
  return;
}

Assistant:

void TPZMatrixMarket::Read(std::string filename, TPZSBMatrix<T>&fmat)
{
    int64_t nrow,ncol,nonzero=0,nsup=0,nlower=0, band=0;
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            if(row-col > band) band = row-col;
            if(col-row > band) band = col-row;
            row--;
            col--;
            if(row > col) nlower++;
            if(row< col ) nsup++;
        }
    }
    fmat.Redim(nrow,ncol);
    fmat.SetBand(band);
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            fmat.PutVal(row,col,val);
        }
    }
}